

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_encode_blockend(char *out_base64,int out_len,base64_encodestate *state)

{
  base64_encodestep bVar1;
  char cVar2;
  char *pcVar3;
  char *out_end;
  char *out_pos;
  base64_encodestate *state_local;
  int out_len_local;
  char *out_base64_local;
  
  pcVar3 = out_base64 + out_len;
  bVar1 = state->step;
  out_end = out_base64;
  if (bVar1 != step_A) {
    if (bVar1 == step_B) {
      if (pcVar3 <= out_base64 + 2) {
        return 0;
      }
      cVar2 = base64_encode_value(state->result);
      *out_base64 = cVar2;
      out_base64[1] = '=';
      out_end = out_base64 + 3;
      out_base64[2] = '=';
    }
    else if (bVar1 == step_C) {
      if (pcVar3 <= out_base64 + 1) {
        return 0;
      }
      cVar2 = base64_encode_value(state->result);
      *out_base64 = cVar2;
      out_end = out_base64 + 2;
      out_base64[1] = '=';
    }
  }
  if (out_end < pcVar3) {
    *out_end = '\0';
  }
  out_base64_local._4_4_ = (int)out_end - (int)out_base64;
  return out_base64_local._4_4_;
}

Assistant:

static int
base64_encode_blockend(char *out_base64, int out_len,
		       struct base64_encodestate *state)
{
	char *out_pos = out_base64;
	char *out_end = out_base64 + out_len;

	switch (state->step) {
	case step_B:
		if (out_pos + 2 >= out_end)
			return out_pos - out_base64;
		*out_pos++ = base64_encode_value(state->result);
		*out_pos++ = '=';
		*out_pos++ = '=';
		break;
	case step_C:
		if (out_pos + 1 >= out_end)
			return out_pos - out_base64;
		*out_pos++ = base64_encode_value(state->result);
		*out_pos++ = '=';
		break;
	case step_A:
		break;
	}
	if (out_pos >= out_end)
		return out_pos - out_base64;
#if 0
	/* Sometimes the output is useful without a newline. */
	*out_pos++ = '\n';
	if (out_pos >= out_end)
		return out_pos - out_base64;
#endif
	*out_pos = '\0';
	return out_pos - out_base64;
}